

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O0

int32 mgau_mixw_read(mgau_model_t *g,char *file_name,float64 mixwfloor)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  double local_98;
  int32 local_90;
  uint local_8c;
  uint local_88;
  int32 n_err;
  int32 n_comp;
  int32 n_feat;
  int32 n_mgau;
  int32 n;
  int32 j;
  int32 i;
  float32 *pdf;
  float32 *buf_f;
  int32 *buf;
  int local_50;
  uint32 chksum;
  int32 chksum_present;
  int32 byteswap;
  FILE *fp;
  char **ppcStack_38;
  char eofchk;
  char **argval;
  char **argname;
  float64 mixwfloor_local;
  char *file_name_local;
  mgau_model_t *g_local;
  
  argname = (char **)mixwfloor;
  mixwfloor_local = (float64)file_name;
  file_name_local = (char *)g;
  if (g->verbose != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
            ,0x20f,"Reading mixture weights file \'%s\'\n",file_name);
  }
  _chksum_present = fopen((char *)mixwfloor_local,"rb");
  if (_chksum_present == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                   ,0x212,"Failed to open mixture weights file");
    g_local._4_4_ = -1;
  }
  else {
    iVar1 = bio_readhdr((FILE *)_chksum_present,&argval,&stack0xffffffffffffffc8,(int32 *)&chksum);
    if (iVar1 < 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x218,"bio_readhdr(%s) failed\n",mixwfloor_local);
      exit(1);
    }
    local_50 = 0;
    for (n = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20),
        argval[n] != (char *)0x0; n = n + 1) {
      iVar2 = strcmp(argval[n],"version");
      if (iVar2 == 0) {
        iVar2 = strcmp(ppcStack_38[n],"1.0");
        if (iVar2 != 0) {
          in_stack_ffffffffffffff58 = 0;
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x220,"Version mismatch(%s): %s, expecting %s\n",mixwfloor_local,ppcStack_38[n],
                  "1.0");
        }
      }
      else {
        iVar2 = strcmp(argval[n],"chksum0");
        if (iVar2 == 0) {
          local_50 = 1;
        }
      }
    }
    bio_hdrarg_free(argval,ppcStack_38);
    ppcStack_38 = (char **)0x0;
    argval = (char **)0x0;
    buf._4_4_ = 0;
    iVar1 = bio_fread(&n_comp,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&buf + 4));
    if ((((iVar1 != 1) ||
         (iVar1 = bio_fread(&n_err,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&buf + 4)),
         iVar1 != 1)) ||
        (iVar1 = bio_fread(&local_88,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&buf + 4)),
        iVar1 != 1)) ||
       (iVar1 = bio_fread(&n_feat,4,1,(FILE *)_chksum_present,chksum,(uint32 *)((long)&buf + 4)),
       iVar1 != 1)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x232,"bio_fread(%s) (arraysize) failed\n",mixwfloor_local);
      exit(1);
    }
    if (*(int *)(file_name_local + 0x38) == 0x2711) {
      if (n_err != 1) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x237,"#Features streams(%d) != 1 in continuous HMM\n",(ulong)(uint)n_err);
        exit(1);
      }
    }
    else {
      if (*(int *)(file_name_local + 0x38) != 0x2712) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x240,
                "How can this happen? Someone must have moved this part of the code somewhere! Not my fault! ARCHAN at 20040504 :-)\n"
               );
        exit(1);
      }
      if (n_err != 4) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x23c,"#Features streams(%d) != 4 in semi-continuous HMM\n",(ulong)(uint)n_err);
        exit(1);
      }
    }
    if (n_feat != n_comp * local_88) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x246,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d\n",mixwfloor_local
              ,(ulong)(uint)n,CONCAT44(uVar5,n_comp),local_88);
      exit(1);
    }
    if (n_comp != *(int *)file_name_local) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x24c,"%s: #Mixture Gaussians(%d) doesn\'t match mean/var parameters(%d)\n",
              mixwfloor_local,(ulong)(uint)n_comp,CONCAT44(uVar5,*(undefined4 *)file_name_local));
      exit(1);
    }
    if (*(int *)(file_name_local + 0x20) == 0x4e23) {
      buf_f = (float32 *)
              __ckd_calloc__((long)(int)(n_comp * local_88),4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                             ,0x251);
      for (n = 0; n < n_comp; n = n + 1) {
        if (local_88 != *(uint *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,599,"Mixture %d: #Weights(%d) doesn\'t match #Gaussian components(%d)\n",
                  (ulong)(uint)n,(ulong)local_88,
                  CONCAT44(uVar5,*(undefined4 *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40)
                          ));
          exit(1);
        }
        *(float32 **)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x30) = buf_f;
        buf_f = buf_f + *(int *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40);
      }
    }
    else {
      if (*(int *)(file_name_local + 0x20) != 0x4e22) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x26a,"Unsupported GMM computation type %d \n",
                (ulong)*(uint *)(file_name_local + 0x20));
        exit(1);
      }
      pdf = (float32 *)
            __ckd_calloc__((long)(int)(n_comp * local_88),4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                           ,0x25f);
      for (n = 0; n < n_comp; n = n + 1) {
        if (local_88 != *(uint *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40)) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x264,"Mixture %d: #Weights(%d) doesn\'t match #Gaussian components(%d)\n",
                  (ulong)(uint)n,(ulong)local_88,
                  CONCAT44(uVar5,*(undefined4 *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40)
                          ));
          exit(1);
        }
        *(float32 **)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x38) = pdf;
        pdf = pdf + *(int *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40);
      }
    }
    _j = (float32 *)
         __ckd_calloc__((long)(int)local_88,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                        ,0x271);
    local_8c = 0;
    for (n = 0; n < n_comp; n = n + 1) {
      uVar3 = bio_fread(_j,4,local_88,(FILE *)_chksum_present,chksum,(uint32 *)((long)&buf + 4));
      if (uVar3 != local_88) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x279,"bio_fread(%s) (arraydata) failed\n",mixwfloor_local);
        exit(1);
      }
      iVar1 = vector_is_zero(_j,local_88);
      if (iVar1 == 0) {
        vector_nz_floor(_j,local_88,(float64)argname);
        vector_sum_norm(_j,local_88);
        for (n_mgau = 0; n_mgau < (int)local_88; n_mgau = n_mgau + 1) {
          if (*(int *)(file_name_local + 0x20) == 0x4e23) {
            if (((float)_j[n_mgau] != 0.0) || (NAN((float)_j[n_mgau]))) {
              local_90 = logs3(*(logmath_t **)(file_name_local + 0x40),
                               (float64)(double)(float)_j[n_mgau]);
            }
            else {
              local_90 = -0x38000000;
            }
            *(int32 *)(*(long *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x30) +
                      (long)n_mgau * 4) = local_90;
          }
          else {
            if (*(int *)(file_name_local + 0x20) != 0x4e22) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                      ,0x298,"Unsupported computation type %d \n",
                      (ulong)*(uint *)(file_name_local + 0x20));
              exit(1);
            }
            if (((float)_j[n_mgau] != 0.0) || (NAN((float)_j[n_mgau]))) {
              local_98 = log((double)(float)_j[n_mgau]);
            }
            else {
              local_98 = -1.0000000150474662e+30;
            }
            *(float *)(*(long *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x38) +
                      (long)n_mgau * 4) = (float)local_98;
          }
        }
      }
      else {
        local_8c = local_8c + 1;
        for (n_mgau = 0; n_mgau < (int)local_88; n_mgau = n_mgau + 1) {
          if (*(int *)(file_name_local + 0x20) == 0x4e23) {
            *(undefined4 *)
             (*(long *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x30) +
             (long)n_mgau * 4) = 0xc8000000;
          }
          else {
            if (*(int *)(file_name_local + 0x20) != 0x4e22) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                      ,0x286,"Unsupported computation type %d \n",
                      (ulong)*(uint *)(file_name_local + 0x20));
              exit(1);
            }
            *(undefined4 *)
             (*(long *)(*(long *)(file_name_local + 0x10) + (long)n * 0x40 + 0x38) +
             (long)n_mgau * 4) = 0xf149f2ca;
          }
        }
      }
    }
    if (0 < (int)local_8c) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x29e,"Weight normalization failed for %d senones\n",(ulong)local_8c);
    }
    ckd_free(_j);
    if (local_50 != 0) {
      bio_verify_chksum((FILE *)_chksum_present,chksum,buf._4_4_);
    }
    sVar4 = fread((void *)((long)&fp + 7),1,1,_chksum_present);
    if (sVar4 == 1) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x2a5,"More data than expected in %s\n",mixwfloor_local);
      exit(1);
    }
    fclose(_chksum_present);
    if (*(int *)(file_name_local + 0x24) != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
              ,0x2aa,"Read %d x %d mixture weights\n",(ulong)(uint)n_comp,(ulong)local_88);
    }
    g_local._4_4_ = 0;
  }
  return g_local._4_4_;
}

Assistant:

static int32
mgau_mixw_read(mgau_model_t * g, const char *file_name, float64 mixwfloor)
{
    char **argname, **argval;
    char eofchk;
    FILE *fp;
    int32 byteswap, chksum_present;
    uint32 chksum;
    int32 *buf;
    float32 *buf_f;
    float32 *pdf;
    int32 i, j, n;
    int32 n_mgau;
    int32 n_feat;
    int32 n_comp;
    int32 n_err;

    if (g->verbose)
        E_INFO("Reading mixture weights file '%s'\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open mixture weights file");
        return -1;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("bio_readhdr(%s) failed\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MGAU_MIXW_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], MGAU_MIXW_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* Read #senones, #features, #codewords, arraysize */
    if ((bio_fread(&n_mgau, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        || (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n_comp, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)) {
        E_FATAL("bio_fread(%s) (arraysize) failed\n", file_name);
    }
    if (g->gau_type == CONTHMM) {
        if (n_feat != 1)
            E_FATAL("#Features streams(%d) != 1 in continuous HMM\n",
                    n_feat);
    }
    else if (g->gau_type == SEMIHMM) {
        if (n_feat != 4)
            E_FATAL("#Features streams(%d) != 4 in semi-continuous HMM\n",
                    n_feat);
    }
    else {
        E_FATAL
            ("How can this happen? Someone must have moved this part of the code somewhere! Not my fault! ARCHAN at 20040504 :-)\n");
    }

    if (n != n_mgau * n_comp) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match header dimensions: %d x %d\n",
             file_name, i, n_mgau, n_comp);
    }

    if (n_mgau != g->n_mgau) {
        E_FATAL
            ("%s: #Mixture Gaussians(%d) doesn't match mean/var parameters(%d)\n",
             file_name, n_mgau, g->n_mgau);
    }

    if (g->comp_type == MIX_INT_FLOAT_COMP) {
        /*Memory allocation of the integer version of mixture weight */
        buf = (int32 *) ckd_calloc(n_mgau * n_comp, sizeof(int32));

        for (i = 0; i < n_mgau; i++) {
            if (n_comp != mgau_n_comp(g, i))
                E_FATAL
                    ("Mixture %d: #Weights(%d) doesn't match #Gaussian components(%d)\n",
                     i, n_comp, mgau_n_comp(g, i));
            g->mgau[i].mixw = buf;
            buf += g->mgau[i].n_comp;
        }

    }
    else if (g->comp_type == FULL_FLOAT_COMP) {
        /*Memory allocation of the floating point version of mixture weight */
        buf_f = (float32 *) ckd_calloc(n_mgau * n_comp, sizeof(float32));
        for (i = 0; i < n_mgau; i++) {
            if (n_comp != mgau_n_comp(g, i))
                E_FATAL
                    ("Mixture %d: #Weights(%d) doesn't match #Gaussian components(%d)\n",
                     i, n_comp, mgau_n_comp(g, i));
            g->mgau[i].mixw_f = buf_f;
            buf_f += g->mgau[i].n_comp;
        }
    }
    else {
        E_FATAL("Unsupported GMM computation type %d \n", g->comp_type);
    }


    /* Temporary structure to read in floats */
    /* In the case of hybrid computation, logs3 will be used to convert 
       the weight to integer */
    pdf = (float32 *) ckd_calloc(n_comp, sizeof(float32));

    /* Read mixw data, normalize, floor. */
    n_err = 0;
    for (i = 0; i < n_mgau; i++) {
        if (bio_fread
            ((void *) pdf, sizeof(float32), n_comp, fp, byteswap,
             &chksum) != n_comp)
            E_FATAL("bio_fread(%s) (arraydata) failed\n", file_name);

        /* Normalize and floor */
        if (vector_is_zero(pdf, n_comp)) {
            n_err++;
            for (j = 0; j < n_comp; j++) {

                if (g->comp_type == MIX_INT_FLOAT_COMP)
                    mgau_mixw(g, i, j) = S3_LOGPROB_ZERO;
                else if (g->comp_type == FULL_FLOAT_COMP)
                    mgau_mixw_f(g, i, j) = S3_LOGPROB_ZERO_F;
                else
                    E_FATAL("Unsupported computation type %d \n",
                            g->comp_type);

            }
        }
        else {
            vector_nz_floor(pdf, n_comp, mixwfloor);
            vector_sum_norm(pdf, n_comp);

            for (j = 0; j < n_comp; j++) {

                if (g->comp_type == MIX_INT_FLOAT_COMP)
                    mgau_mixw(g, i, j) =
                        (pdf[j] != 0.0) ? logs3(g->logmath, pdf[j]) : S3_LOGPROB_ZERO;
                else if (g->comp_type == FULL_FLOAT_COMP)
                    mgau_mixw_f(g, i, j) =
                        (pdf[j] != 0.0) ? log(pdf[j]) : S3_LOGPROB_ZERO_F;
                else
                    E_FATAL("Unsupported computation type %d \n",
                            g->comp_type);

            }
        }
    }
    if (n_err > 0)
        E_WARN("Weight normalization failed for %d senones\n", n_err);
    ckd_free(pdf);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&eofchk, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    if (g->verbose)
        E_INFO("Read %d x %d mixture weights\n", n_mgau, n_comp);


    return 0;
}